

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnTableInitExpr(Validator *this,TableInitExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  TableInitExpr *local_20;
  TableInitExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (TableInitExpr *)this;
  Var::Var(&local_70,&expr->segment_index);
  Var::Var(&local_b8,&local_20->table_index);
  local_24 = (Enum)SharedValidator::OnTableInit
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)47>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnTableInitExpr(TableInitExpr* expr) {
  result_ |=
      validator_.OnTableInit(expr->loc, expr->segment_index, expr->table_index);
  return Result::Ok;
}